

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Relations * __thiscall dg::vr::Relations::invert(Relations *this)

{
  bool bVar1;
  bitset<12UL> *this_00;
  bitset<12UL> *__position;
  Relations *in_RDI;
  Type rel;
  const_iterator __end2;
  const_iterator __begin2;
  array<dg::vr::Relations::Type,_12UL> *__range2;
  bitset<12UL> newBits;
  Type in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  bitset<12UL> local_10 [2];
  undefined1 __val;
  
  std::bitset<12UL>::bitset((bitset<12UL> *)0x102a6c);
  this_00 = (bitset<12UL> *)
            std::array<dg::vr::Relations::Type,_12UL>::begin
                      ((array<dg::vr::Relations::Type,_12UL> *)0x102a84);
  __position = (bitset<12UL> *)
               std::array<dg::vr::Relations::Type,_12UL>::end
                         ((array<dg::vr::Relations::Type,_12UL> *)0x102a95);
  for (; this_00 != __position;
      this_00 = (bitset<12UL> *)((long)&(this_00->super__Base_bitset<1UL>)._M_w + 4)) {
    uVar2 = (undefined4)(this_00->super__Base_bitset<1UL>)._M_w;
    bVar1 = has((Relations *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),(Type)((ulong)in_RDI >> 0x20)
               );
    __val = (undefined1)((uint)uVar2 >> 0x18);
    if (bVar1) {
      inverted(in_stack_ffffffffffffffd0);
      std::bitset<12UL>::set(this_00,(size_t)__position,(bool)__val);
    }
  }
  std::swap<std::bitset<12ul>>(&in_RDI->bits,local_10);
  return in_RDI;
}

Assistant:

Relations &Relations::invert() {
    std::bitset<Relations::total> newBits;
    for (Type rel : Relations::all) {
        if (has(rel)) {
            newBits.set(inverted(rel));
        }
    }

    std::swap(bits, newBits);
    return *this;
}